

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O1

duration<long,_boost::ratio<1L,_1L>_>
hungarian_algorithm::
solve<boost::chrono::duration<long,boost::ratio<1l,1l>>,unsigned_long,boost::numeric::ublas::matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::allocator<boost::chrono::duration<long,boost::ratio<1l,1l>>>>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
          (matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
           *cost_function,unsigned_long num_rows,unsigned_long num_cols,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *assignment_map,
          less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_> *cost_comparator)

{
  duration<long,_boost::ratio<1L,_1L>_> dVar1;
  HungarianSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_unsigned_long,_std::less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
  solver;
  duration<long,_boost::ratio<1L,_1L>_> local_120;
  HungarianSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_unsigned_long,_std::less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
  local_118;
  
  HungarianSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_unsigned_long,_std::less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
  ::HungarianSolver(&local_118,num_rows,num_cols,cost_comparator,&local_120);
  HungarianSolver<boost::chrono::duration<long,boost::ratio<1l,1l>>,unsigned_long,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
  ::
  solve<boost::numeric::ublas::matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::allocator<boost::chrono::duration<long,boost::ratio<1l,1l>>>>>>
            ((HungarianSolver<boost::chrono::duration<long,boost::ratio<1l,1l>>,unsigned_long,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
              *)&local_118,cost_function);
  dVar1 = HungarianSolver<boost::chrono::duration<long,boost::ratio<1l,1l>>,unsigned_long,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
          ::
          getAssignment<boost::numeric::ublas::matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::allocator<boost::chrono::duration<long,boost::ratio<1l,1l>>>>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                    ((HungarianSolver<boost::chrono::duration<long,boost::ratio<1l,1l>>,unsigned_long,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
                      *)&local_118,cost_function,assignment_map);
  if (local_118.cost_matrix_.
      super__Vector_base<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.cost_matrix_.
                    super__Vector_base<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  HungarianSolverBase::~HungarianSolverBase(&local_118.super_HungarianSolverBase);
  return (duration<long,_boost::ratio<1L,_1L>_>)dVar1.rep_;
}

Assistant:

Cost solve(const CostFunction& cost_function, const Size num_rows, const Size num_cols, AssignmentMap& assignment_map,
           const CostComparator& cost_comparator)
{
  HungarianSolver<Cost, Size, CostComparator> solver(num_rows, num_cols, cost_comparator, Cost());
  solver.solve(cost_function);
  return solver.getAssignment(cost_function, assignment_map);
}